

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objloader.cpp
# Opt level: O3

MeshData ObjLoader::loadOBJ(string *filePath,bool *succes)

{
  float fVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ResourceManager *pRVar5;
  FILE *__stream;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer puVar10;
  MeshData MVar11;
  undefined1 local_678 [8];
  vec3 vertex;
  undefined1 local_288 [8];
  char lineHeader [128];
  string local_1e8;
  size_type *local_1c8;
  string vertex3;
  anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2 local_198;
  string vertex2;
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  temp_vertices;
  void *pvStack_158;
  vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
  temp_uvs;
  void *pvStack_138;
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  temp_normals;
  void *pvStack_118;
  vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
  out_uvs;
  void *pvStack_f8;
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  out_normals;
  void *pvStack_d8;
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  out_vertices;
  void *pvStack_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uvIndices;
  void *pvStack_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> normalIndices;
  uint local_78;
  uint vertexIndex [3];
  uint uvIndex [3];
  uint normalIndex [3];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexIndices;
  MeshData meshData;
  
  *succes = false;
  pRVar5 = ResourceManager::getInstance();
  pcVar2 = (filePath->_M_dataplus)._M_p;
  lineHeader._120_8_ = &stack0xfffffffffffffe08;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(lineHeader + 0x78),pcVar2,pcVar2 + filePath->_M_string_length);
  join_0x00000010_0x00000000_ =
       ResourceManager::getMeshData(pRVar5,(string *)(lineHeader + 0x78),succes);
  if ((undefined1 *)lineHeader._120_8_ != &stack0xfffffffffffffe08) {
    operator_delete((void *)lineHeader._120_8_);
  }
  if (*succes == true) {
    uVar8 = (ulong)vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000;
    uVar7 = meshData._0_8_;
    puVar10 = vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  else {
    vertex3.field_2._8_8_ = succes;
    printf("Loading OBJ file %s...\n",(filePath->_M_dataplus)._M_p);
    vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    normalIndex[1] = 0;
    normalIndex[2] = 0;
    vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pvStack_b8 = (void *)0x0;
    uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pvStack_98 = (void *)0x0;
    normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vertex2.field_2._8_8_ = 0;
    temp_vertices.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp_uvs.
    super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pvStack_158 = (void *)0x0;
    temp_uvs.
    super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp_normals.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pvStack_138 = (void *)0x0;
    temp_normals.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    out_vertices.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pvStack_d8 = (void *)0x0;
    out_vertices.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    out_uvs.
    super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pvStack_118 = (void *)0x0;
    out_uvs.
    super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    out_normals.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pvStack_f8 = (void *)0x0;
    out_normals.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    __stream = fopen((filePath->_M_dataplus)._M_p,"r");
    if (__stream != (FILE *)0x0) {
LAB_0017abf3:
      while( true ) {
        iVar4 = __isoc99_fscanf(__stream,"%s",local_288);
        if (iVar4 == -1) break;
        if (local_288._0_2_ == 0x76) {
          local_678 = (undefined1  [8])0x0;
          vertex.field_0._0_8_ = (ulong)(uint)vertex.field_0.field_0.y << 0x20;
          __isoc99_fscanf(__stream,"%f %f %f\n",(tvec3<float,_(glm::precision)0> *)local_678,
                          local_678 + 4,&vertex);
          if (temp_vertices.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
            std::
            vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
            ::_M_realloc_insert<glm::tvec3<float,(glm::precision)0>const&>
                      ((vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
                        *)(vertex2.field_2._M_local_buf + 8),(iterator)0x0,
                       (tvec3<float,_(glm::precision)0> *)local_678);
          }
          else {
            ((temp_vertices.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0).field_0.z =
                 vertex.field_0.field_0.x;
            *(undefined1 (*) [8])
             &(temp_vertices.
               super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0 = local_678;
            temp_vertices.
            super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 temp_vertices.
                 super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        else if (local_288[2] == '\0' && local_288._0_2_ == 0x7476) {
          local_678 = (undefined1  [8])0x0;
          __isoc99_fscanf(__stream,"%f %f\n",(tvec3<float,_(glm::precision)0> *)local_678);
          local_678 = (undefined1  [8])((ulong)local_678 ^ 0x8000000000000000);
          if (temp_uvs.
              super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              temp_uvs.
              super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<glm::tvec2<float,(glm::precision)0>,std::allocator<glm::tvec2<float,(glm::precision)0>>>
            ::_M_realloc_insert<glm::tvec2<float,(glm::precision)0>const&>
                      ((vector<glm::tvec2<float,(glm::precision)0>,std::allocator<glm::tvec2<float,(glm::precision)0>>>
                        *)&pvStack_158,
                       (iterator)
                       temp_uvs.
                       super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (tvec2<float,_(glm::precision)0> *)local_678);
          }
          else {
            (temp_uvs.
             super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->field_0 =
                 (anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2)local_678;
            temp_uvs.
            super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 temp_uvs.
                 super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        else if (local_288[2] == '\0' && local_288._0_2_ == 0x6e76) {
          local_678 = (undefined1  [8])0x0;
          vertex.field_0._0_8_ = (ulong)(uint)vertex.field_0.field_0.y << 0x20;
          __isoc99_fscanf(__stream,"%f %f %f\n",(tvec3<float,_(glm::precision)0> *)local_678,
                          local_678 + 4,&vertex);
          if (temp_normals.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              temp_normals.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
            ::_M_realloc_insert<glm::tvec3<float,(glm::precision)0>const&>
                      ((vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
                        *)&pvStack_138,
                       (iterator)
                       temp_normals.
                       super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (tvec3<float,_(glm::precision)0> *)local_678);
          }
          else {
            ((temp_normals.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0).field_0.z =
                 vertex.field_0.field_0.x;
            *(undefined1 (*) [8])
             &(temp_normals.
               super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0 = local_678;
            temp_normals.
            super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 temp_normals.
                 super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        else {
          if (local_288._0_2_ == 0x66) goto code_r0x0017acc8;
          fgets((char *)local_678,1000,__stream);
        }
      }
      if (vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)normalIndex._4_8_) {
        uVar8 = 0;
        uVar9 = 1;
        do {
          uVar6 = (ulong)(*(int *)(normalIndex._4_8_ + uVar8 * 4) - 1);
          local_678 = *(undefined1 (*) [8])(vertex2.field_2._8_8_ + uVar6 * 0xc);
          fVar1 = *(float *)(vertex2.field_2._8_8_ + 8 + uVar6 * 0xc);
          vertex.field_0.field_0.x = fVar1;
          local_198 = *(anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2 *)
                       ((long)pvStack_158 + (ulong)(*(int *)((long)pvStack_b8 + uVar8 * 4) - 1) * 8)
          ;
          uVar8 = (ulong)(*(int *)((long)pvStack_98 + uVar8 * 4) - 1);
          local_288 = *(undefined1 (*) [8])((long)pvStack_138 + uVar8 * 0xc);
          lineHeader._0_4_ = *(undefined4 *)((long)pvStack_138 + uVar8 * 0xc + 8);
          if (out_vertices.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              out_vertices.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
            ::_M_realloc_insert<glm::tvec3<float,(glm::precision)0>const&>
                      ((vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
                        *)&pvStack_d8,
                       (iterator)
                       out_vertices.
                       super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (tvec3<float,_(glm::precision)0> *)local_678);
          }
          else {
            ((out_vertices.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0).field_0.z = fVar1;
            *(undefined1 (*) [8])
             &(out_vertices.
               super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0 = local_678;
            out_vertices.
            super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 out_vertices.
                 super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          if (out_uvs.
              super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              out_uvs.
              super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<glm::tvec2<float,(glm::precision)0>,std::allocator<glm::tvec2<float,(glm::precision)0>>>
            ::_M_realloc_insert<glm::tvec2<float,(glm::precision)0>const&>
                      ((vector<glm::tvec2<float,(glm::precision)0>,std::allocator<glm::tvec2<float,(glm::precision)0>>>
                        *)&pvStack_118,
                       (iterator)
                       out_uvs.
                       super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (tvec2<float,_(glm::precision)0> *)&local_198.field_0);
          }
          else {
            (out_uvs.
             super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->field_0 = local_198;
            out_uvs.
            super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 out_uvs.
                 super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          if (out_normals.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              out_normals.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
            ::_M_realloc_insert<glm::tvec3<float,(glm::precision)0>const&>
                      ((vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
                        *)&pvStack_f8,
                       (iterator)
                       out_normals.
                       super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (tvec3<float,_(glm::precision)0> *)local_288);
          }
          else {
            ((out_normals.
              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0).field_0.z =
                 (float)lineHeader._0_4_;
            *(undefined1 (*) [8])
             &(out_normals.
               super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0 = local_288;
            out_normals.
            super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 out_normals.
                 super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          bVar3 = uVar9 < (ulong)((long)vertexIndices.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start -
                                  normalIndex._4_8_ >> 2);
          uVar8 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar3);
      }
      *(undefined1 *)vertex3.field_2._8_8_ = 1;
      (*__glewBindVertexArray)
                ((GLuint)vertexIndices.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      (*__glewGenBuffers)(1,(GLuint *)
                            &vertexIndices.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
      (*__glewBindBuffer)(0x8892,(GLuint)vertexIndices.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (*__glewBufferData)(0x8892,(long)out_vertices.
                                       super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)pvStack_d8,
                          pvStack_d8,0x88e4);
      (*__glewGenBuffers)(1,&meshData.vertexBuffer);
      (*__glewBindBuffer)(0x8892,meshData.vertexBuffer);
      (*__glewBufferData)(0x8892,(long)out_uvs.
                                       super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)pvStack_118
                          ,pvStack_118,0x88e4);
      (*__glewGenBuffers)(1,(GLuint *)
                            ((long)&vertexIndices.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      (*__glewBindBuffer)(0x8892,vertexIndices.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      (*__glewBufferData)(0x8892,(long)out_normals.
                                       super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)pvStack_f8,
                          pvStack_f8,0x88e4);
      meshData.normalBuffer =
           (int)((ulong)((long)out_vertices.
                               super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)pvStack_d8) >> 2) *
           -0x55555555;
      pRVar5 = ResourceManager::getInstance();
      MVar11 = stack0xffffffffffffffc0;
      pcVar2 = (filePath->_M_dataplus)._M_p;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,pcVar2,pcVar2 + filePath->_M_string_length);
      ResourceManager::addMeshData(pRVar5,MVar11,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      uVar8 = (ulong)vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000;
      uVar7 = meshData._0_8_;
      puVar10 = vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      goto LAB_0017b3b2;
    }
    printf("Impossible to open the file ! Are you in the right path ?");
    getchar();
LAB_0017b3ad:
    uVar8 = 0xffffffff00000000;
    uVar7._0_4_ = 0xffffffff;
    uVar7._4_4_ = 0;
    puVar10 = (pointer)0xffffffff;
LAB_0017b3b2:
    if (pvStack_f8 != (void *)0x0) {
      operator_delete(pvStack_f8);
    }
    if (pvStack_118 != (void *)0x0) {
      operator_delete(pvStack_118);
    }
    if (pvStack_d8 != (void *)0x0) {
      operator_delete(pvStack_d8);
    }
    if (pvStack_138 != (void *)0x0) {
      operator_delete(pvStack_138);
    }
    if (pvStack_158 != (void *)0x0) {
      operator_delete(pvStack_158);
    }
    if (vertex2.field_2._8_8_ != 0) {
      operator_delete((void *)vertex2.field_2._8_8_);
    }
    if (pvStack_98 != (void *)0x0) {
      operator_delete(pvStack_98);
    }
    if (pvStack_b8 != (void *)0x0) {
      operator_delete(pvStack_b8);
    }
    if (normalIndex._4_8_ != 0) {
      operator_delete((void *)normalIndex._4_8_);
    }
  }
  MVar11._0_8_ = (ulong)puVar10 & 0xffffffff | uVar8;
  MVar11.uvBuffer = (GLuint)uVar7;
  MVar11.numVerts = SUB84(uVar7,4);
  return MVar11;
code_r0x0017acc8:
  local_678 = (undefined1  [8])((long)&vertex.field_0 + 8);
  vertex.field_0._0_8_ = 0;
  vertex.field_0._8_1_ = 0;
  local_198 = (anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2)
              &vertex2._M_string_length;
  vertex2._M_dataplus._M_p = (pointer)0x0;
  vertex2._M_string_length._0_1_ = 0;
  local_1c8 = &vertex3._M_string_length;
  vertex3._M_dataplus._M_p = (pointer)0x0;
  vertex3._M_string_length._0_1_ = 0;
  iVar4 = __isoc99_fscanf(__stream,"%d/%d/%d %d/%d/%d %d/%d/%d\n",
                          (undefined1 *)
                          ((long)&normalIndices.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                          vertexIndex + 1,uvIndex + 1,&local_78,vertexIndex + 2,uvIndex + 2,
                          vertexIndex,uvIndex,normalIndex);
  if (iVar4 == 9) {
    if (vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)(normalIndex + 1),
                 (iterator)
                 vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (uint *)((long)&normalIndices.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    }
    else {
      *vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start =
           normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    if (vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)(normalIndex + 1),
                 (iterator)
                 vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,&local_78);
    }
    else {
      *vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = local_78;
      vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    if (vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)(normalIndex + 1),
                 (iterator)
                 vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,vertexIndex);
    }
    else {
      *vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = vertexIndex[0];
      vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    if (uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pvStack_b8,
                 (iterator)
                 uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,vertexIndex + 1);
    }
    else {
      *uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = vertexIndex[1];
      uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    if (uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pvStack_b8,
                 (iterator)
                 uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,vertexIndex + 2);
    }
    else {
      *uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = vertexIndex[2];
      uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    if (uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pvStack_b8,
                 (iterator)
                 uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,uvIndex);
    }
    else {
      *uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = uvIndex[0];
      uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    if (normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pvStack_98,
                 (iterator)
                 normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,uvIndex + 1);
    }
    else {
      *normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = uvIndex[1];
      normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    if (normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pvStack_98,
                 (iterator)
                 normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,uvIndex + 2);
    }
    else {
      *normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = uvIndex[2];
      normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    if (normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pvStack_98,
                 (iterator)
                 normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,normalIndex);
    }
    else {
      *normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = normalIndex[0];
      normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
  }
  else {
    puts("File can\'t be read by this simple parser :-( Try exporting with other options");
  }
  if (local_1c8 != &vertex3._M_string_length) {
    operator_delete(local_1c8);
  }
  if (local_198 !=
      (anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2)&vertex2._M_string_length) {
    operator_delete((void *)local_198);
  }
  if (local_678 != (undefined1  [8])((long)&vertex.field_0 + 8)) {
    operator_delete((void *)local_678);
  }
  if (iVar4 != 9) goto LAB_0017b3ad;
  goto LAB_0017abf3;
}

Assistant:

MeshData ObjLoader::loadOBJ(std::string filePath, bool &succes)
{
	succes = false;
	MeshData meshData = ResourceManager::getInstance()->getMeshData(filePath, succes);
	if (succes)
	{
		return meshData;
	}
	printf("Loading OBJ file %s...\n", filePath.c_str());

	std::vector<unsigned int> vertexIndices, uvIndices, normalIndices;
	std::vector<glm::vec3> temp_vertices;
	std::vector<glm::vec2> temp_uvs;
	std::vector<glm::vec3> temp_normals;

	std::vector<glm::vec3> out_vertices;
	std::vector<glm::vec2> out_uvs;
	std::vector<glm::vec3> out_normals;


	FILE * file = fopen(filePath.c_str(), "r");
	if (file == NULL)
	{
		printf("Impossible to open the file ! Are you in the right path ?");
		getchar();
		return MeshData();
	}

	while (1)
	{

		char lineHeader[128];
		// read the first word of the line
		int res = fscanf(file, "%s", lineHeader);
		if (res == EOF)
			break; // EOF = End Of File. Quit the loop.

		// else : parse lineHeader

		if (strcmp(lineHeader, "v") == 0)
		{
			glm::vec3 vertex;
			fscanf(file, "%f %f %f\n", &vertex.x, &vertex.y, &vertex.z);
			temp_vertices.push_back(vertex);
		}
		else if (strcmp(lineHeader, "vt") == 0)
		{
			glm::vec2 uv;
			fscanf(file, "%f %f\n", &uv.x, &uv.y);
			uv.y = -uv.y; // Invert V coordinate since we will only use DDS texture, which are inverted. Remove if you want to use TGA or BMP loaders.
			temp_uvs.push_back(uv);
		}
		else if (strcmp(lineHeader, "vn") == 0)
		{
			glm::vec3 normal;
			fscanf(file, "%f %f %f\n", &normal.x, &normal.y, &normal.z);
			temp_normals.push_back(normal);
		}
		else if (strcmp(lineHeader, "f") == 0)
		{
			std::string vertex1, vertex2, vertex3;
			unsigned int vertexIndex[3], uvIndex[3], normalIndex[3];
			int matches = fscanf(file, "%d/%d/%d %d/%d/%d %d/%d/%d\n", &vertexIndex[0], &uvIndex[0], &normalIndex[0], &vertexIndex[1], &uvIndex[1], &normalIndex[1], &vertexIndex[2], &uvIndex[2], &normalIndex[2]);
			if (matches != 9)
			{
				printf("File can't be read by this simple parser :-( Try exporting with other options\n");
				return MeshData();
			}
			vertexIndices.push_back(vertexIndex[0]);
			vertexIndices.push_back(vertexIndex[1]);
			vertexIndices.push_back(vertexIndex[2]);
			uvIndices.push_back(uvIndex[0]);
			uvIndices.push_back(uvIndex[1]);
			uvIndices.push_back(uvIndex[2]);
			normalIndices.push_back(normalIndex[0]);
			normalIndices.push_back(normalIndex[1]);
			normalIndices.push_back(normalIndex[2]);
		}
		else
		{
			// Probably a comment, eat up the rest of the line
			char stupidBuffer[1000];
			fgets(stupidBuffer, 1000, file);
		}

	}

	// For each vertex of each triangle
	for (unsigned int i = 0; i < vertexIndices.size(); i++)
	{

		// Get the indices of its attributes
		unsigned int vertexIndex = vertexIndices[i];
		unsigned int uvIndex = uvIndices[i];
		unsigned int normalIndex = normalIndices[i];

		// Get the attributes thanks to the index
		glm::vec3 vertex = temp_vertices[vertexIndex - 1];
		glm::vec2 uv = temp_uvs[uvIndex - 1];
		glm::vec3 normal = temp_normals[normalIndex - 1];

		// Put the attributes in buffers
		out_vertices.push_back(vertex);
		out_uvs.push_back(uv);
		out_normals.push_back(normal);
		
	}
	succes = true;

	glBindVertexArray(meshData.vertexBuffer);
	glGenBuffers(1, &meshData.vertexBuffer);
	glBindBuffer(GL_ARRAY_BUFFER, meshData.vertexBuffer);
	glBufferData(GL_ARRAY_BUFFER, out_vertices.size() * sizeof(glm::vec3), &out_vertices[0], GL_STATIC_DRAW);

	glGenBuffers(1, &meshData.uvBuffer);
	glBindBuffer(GL_ARRAY_BUFFER, meshData.uvBuffer);
	glBufferData(GL_ARRAY_BUFFER, out_uvs.size() * sizeof(glm::vec2), &out_uvs[0], GL_STATIC_DRAW);

	glGenBuffers(1, &meshData.normalBuffer);
	glBindBuffer(GL_ARRAY_BUFFER, meshData.normalBuffer);
	glBufferData(GL_ARRAY_BUFFER, out_normals.size() * sizeof(glm::vec3), &out_normals[0], GL_STATIC_DRAW);
	
	meshData.numVerts = out_vertices.size();
	ResourceManager::getInstance()->addMeshData(meshData, filePath);
	return meshData;
}